

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  cmCustomCommand *cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  string *__x;
  pointer ppcVar5;
  pointer path;
  string currentBinDir;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  string local_178;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_158;
  string local_138;
  string local_118;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_f8;
  string *local_d8;
  pointer local_d0;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_c8;
  undefined1 local_a8 [120];
  
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string((string *)local_a8,"CMAKE_BUILD_TYPE",(allocator *)&local_178);
  pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_a8);
  std::__cxx11::string::string((string *)&local_118,pcVar3,(allocator *)&local_138);
  std::__cxx11::string::~string((string *)local_a8);
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string
            ((string *)local_a8,"ADDITIONAL_MAKE_CLEAN_FILES",(allocator *)&local_178);
  pcVar3 = cmMakefile::GetProperty(pcVar1,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  if (pcVar3 != (char *)0x0) {
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&local_178);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_a8,(cmListFileBacktrace *)&local_178);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_178);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_178,local_a8);
    local_158._M_impl.super__Vector_impl_data._M_start = (pointer)local_178._M_dataplus._M_p;
    local_178._M_dataplus._M_p = (pointer)0x0;
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_178);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_string_length = 0;
    local_138.field_2._M_allocated_capacity =
         local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pcVar3 = cmCompiledGeneratorExpression::Evaluate
                       ((cmCompiledGeneratorExpression *)
                        local_158._M_impl.super__Vector_impl_data._M_start,
                        (cmLocalGenerator *)this->LocalGenerator,&local_118,false,
                        (this->super_cmCommonTargetGenerator).GeneratorTarget,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,&local_138);
    std::__cxx11::string::string((string *)&local_178,pcVar3,(allocator *)&local_f8);
    cmSystemTools::ExpandListArgument(&local_178,&this->CleanFiles,false);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_138);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_158);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_a8);
  }
  pcVar1 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string((string *)local_a8,"CLEAN_NO_CUSTOM",(allocator *)&local_178);
  pcVar3 = cmMakefile::GetProperty(pcVar1,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  bVar2 = cmSystemTools::IsOff(pcVar3);
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_158,
             &local_118);
  pcVar3 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this->LocalGenerator);
  std::__cxx11::string::string((string *)&local_178,pcVar3,(allocator *)local_a8);
  local_d8 = &(this->super_cmCommonTargetGenerator).ConfigName;
  ppcVar5 = local_158._M_impl.super__Vector_impl_data._M_start;
  while (ppcVar5 != local_158._M_impl.super__Vector_impl_data._M_finish) {
    cc = cmSourceFile::GetCustomCommand(*ppcVar5);
    cmCustomCommandGenerator::cmCustomCommandGenerator
              ((cmCustomCommandGenerator *)local_a8,cc,local_d8,
               (cmLocalGenerator *)this->LocalGenerator);
    local_d0 = ppcVar5;
    GenerateCustomRuleFile(this,(cmCustomCommandGenerator *)local_a8);
    if (bVar2) {
      pvVar4 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_((cmCustomCommandGenerator *)local_a8)
      ;
      for (path = (pvVar4->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
          path != (pvVar4->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; path = path + 1) {
        cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
                  (&local_138,this->LocalGenerator,&local_178,path);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->CleanFiles,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
      }
    }
    cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_a8);
    ppcVar5 = local_d0 + 1;
  }
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  local_a8._16_8_ = 0;
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_a8,
             &local_118);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_a8,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  local_138._M_dataplus._M_p = (pointer)0x0;
  local_138._M_string_length = 0;
  local_138.field_2._M_allocated_capacity = 0;
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_138,
             &local_118);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_138,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetExternalObjects
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_f8,
             &local_118);
  for (ppcVar5 = local_f8._M_impl.super__Vector_impl_data._M_start;
      ppcVar5 != local_f8._M_impl.super__Vector_impl_data._M_finish; ppcVar5 = ppcVar5 + 1) {
    __x = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->ExternalObjects,__x);
  }
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmGeneratorTarget::GetObjectSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_c8,
             &local_118);
  for (ppcVar5 = local_c8._M_impl.super__Vector_impl_data._M_start;
      ppcVar5 != local_c8._M_impl.super__Vector_impl_data._M_finish; ppcVar5 = ppcVar5 + 1) {
    WriteObjectRuleFiles(this,*ppcVar5);
  }
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_c8);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_f8);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            ((_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_138
            );
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            ((_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_a8);
  std::__cxx11::string::~string((string *)&local_178);
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_158);
  std::__cxx11::string::~string((string *)&local_118);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");

  // write the custom commands for this target
  // Look for files registered for cleaning in this directory.
  if (const char* additional_clean_files =
        this->Makefile->GetProperty("ADDITIONAL_MAKE_CLEAN_FILES")) {
    cmGeneratorExpression ge;
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge =
      ge.Parse(additional_clean_files);

    cmSystemTools::ExpandListArgument(
      cge->Evaluate(this->LocalGenerator, config, false, this->GeneratorTarget,
                    CM_NULLPTR, CM_NULLPTR),
      this->CleanFiles);
  }

  // add custom commands to the clean rules?
  const char* clean_no_custom = this->Makefile->GetProperty("CLEAN_NO_CUSTOM");
  bool clean = cmSystemTools::IsOff(clean_no_custom);

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands, config);
  std::string currentBinDir =
    this->LocalGenerator->GetCurrentBinaryDirectory();
  for (std::vector<cmSourceFile const*>::const_iterator si =
         customCommands.begin();
       si != customCommands.end(); ++si) {
    cmCustomCommandGenerator ccg(*(*si)->GetCustomCommand(), this->ConfigName,
                                 this->LocalGenerator);
    this->GenerateCustomRuleFile(ccg);
    if (clean) {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for (std::vector<std::string>::const_iterator o = outputs.begin();
           o != outputs.end(); ++o) {
        this->CleanFiles.push_back(
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir, *o));
      }
    }
  }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources, this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources, this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects, config);
  for (std::vector<cmSourceFile const*>::const_iterator si =
         externalObjects.begin();
       si != externalObjects.end(); ++si) {
    this->ExternalObjects.push_back((*si)->GetFullPath());
  }
  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources, config);
  for (std::vector<cmSourceFile const*>::const_iterator si =
         objectSources.begin();
       si != objectSources.end(); ++si) {
    // Generate this object file's rule file.
    this->WriteObjectRuleFiles(**si);
  }
}